

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binarySearch.cpp
# Opt level: O3

int main(void)

{
  char cVar1;
  int iVar2;
  vector<int,_std::allocator<int>_> *retVector;
  ostream *poVar3;
  string inFileName;
  undefined1 *local_70;
  long local_68;
  undefined1 local_60 [16];
  string local_50;
  
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"","");
  while( true ) {
    iVar2 = std::__cxx11::string::compare((char *)&local_70);
    if (iVar2 != 0) break;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "Please type the filename that you would like to search for 0 in: ",0x41);
    cVar1 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + '\x10');
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)&local_70,cVar1);
  }
  retVector = (vector<int,_std::allocator<int>_> *)operator_new(0x18);
  (retVector->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (retVector->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (retVector->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_50,local_70,local_70 + local_68);
  ReadFile(&local_50,retVector);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((retVector->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish !=
      (retVector->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start) {
    clock();
    iVar2 = binarySearch(retVector,0,
                         (int)((ulong)((long)(retVector->
                                             super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                             super__Vector_impl_data._M_finish -
                                      (long)(retVector->
                                            super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                            super__Vector_impl_data._M_start) >> 2),0);
    clock();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Total time was ",0xf);
    poVar3 = std::ostream::_M_insert<long>((long)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," processor cycles.",0x12);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    cVar1 = (char)*(undefined8 *)(std::cout + -0x18) + -0x40;
    if (iVar2 == -1) {
      std::ios::widen(cVar1);
      std::ostream::put(-0x40);
      poVar3 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"No 0 found!",0xb);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    }
    else {
      std::ios::widen(cVar1);
      std::ostream::put(-0x40);
      poVar3 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Found 0 at position: ",0x15);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," (0-indexed)",0xc);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    }
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    if (local_70 != local_60) {
      operator_delete(local_70);
    }
    return 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"File does not exist!",0x14);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  exit(1);
}

Assistant:

int main()
{
    std::string inFileName = "";

    while(inFileName == "")
    {
        std::cout << "Please type the filename that you would like to search for 0 in: ";
        getline(std::cin, inFileName);
    }

    std::vector<int> *searchInts = new std::vector<int>;
    ReadFile(inFileName, searchInts);
    if(searchInts->size() == 0)
    {
        std::cout << "File does not exist!" << std::endl;
        exit(1);
    }
    std::clock_t t;
    t = clock();
    int position = binarySearch(searchInts, 0, searchInts->size(), 0);
    t = clock() - t;
    std::cout << "Total time was " << t << " processor cycles." << std::endl;

    if(position == -1)
    {
        std::cout << std::endl << "No 0 found!" << std::endl;
    }
    else
    {
        std::cout << std::endl << "Found 0 at position: " << position << " (0-indexed)" << std::endl;
    }

    return 0;
}